

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

string * __thiscall MlmWrap::getEndpoint_abi_cxx11_(MlmWrap *this)

{
  network_pimpl *in_RDI;
  
  network_pimpl::getEndpoint_abi_cxx11_(in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string MlmWrap::getEndpoint() const{
    return state->getEndpoint();
}